

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

ON_LineCurve * __thiscall ON_Extrusion::PathLineCurve(ON_Extrusion *this,ON_LineCurve *line_curve)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  ON_Interval path_domain;
  ON_Interval local_28;
  
  bVar6 = ON_Line::IsValid(&this->m_path);
  if (bVar6) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    bVar6 = ON_Interval::IsIncreasing(&local_28);
    if (bVar6) {
      if (line_curve == (ON_LineCurve *)0x0) {
        line_curve = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(line_curve);
      }
      dVar1 = (this->m_path).from.x;
      dVar2 = (this->m_path).from.y;
      dVar3 = (this->m_path).from.z;
      dVar4 = (this->m_path).to.x;
      dVar5 = (this->m_path).to.z;
      (line_curve->m_line).to.y = (this->m_path).to.y;
      (line_curve->m_line).to.z = dVar5;
      (line_curve->m_line).from.z = dVar3;
      (line_curve->m_line).to.x = dVar4;
      (line_curve->m_line).from.x = dVar1;
      (line_curve->m_line).from.y = dVar2;
      pdVar7 = ON_Interval::operator[](&local_28,0);
      dVar1 = *pdVar7;
      pdVar7 = ON_Interval::operator[](&local_28,1);
      (*(line_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (SUB84(dVar1,0),SUB84(*pdVar7,0),line_curve);
      return line_curve;
    }
  }
  return (ON_LineCurve *)0x0;
}

Assistant:

ON_LineCurve* ON_Extrusion::PathLineCurve(ON_LineCurve* line_curve) const
{
  if ( !m_path.IsValid() )
    return 0;

  ON_Interval path_domain = Domain(PathParameter());
  if ( !path_domain.IsIncreasing() )
    return 0;

  if ( 0 == line_curve )
    line_curve = new ON_LineCurve();
  line_curve->m_line = m_path;
  line_curve->SetDomain( path_domain[0], path_domain[1] );

  return line_curve;
}